

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O1

void __thiscall Procedure::Procedure(Procedure *this,int *fa_,string *name_)

{
  (this->pName)._M_dataplus._M_p = (pointer)&(this->pName).field_2;
  (this->pName)._M_string_length = 0;
  (this->pName).field_2._M_local_buf[0] = '\0';
  (this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->pName);
  this->fa = *fa_;
  this->level = -1;
  this->nowDx = 3;
  return;
}

Assistant:

Procedure(const int &fa_, const std::string &name_) {
		pName = name_;
		fa = fa_;
		nowDx = 3;
		level = -1;
	}